

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O2

double Js::JavascriptNumber::DirectPowDoubleInt(double x,int32 y)

{
  uint uVar1;
  double dVar2;
  
  if (y + 8U < 0x11) {
    uVar1 = -y;
    if (0 < y) {
      uVar1 = y;
    }
    dVar2 = 1.0;
    while( true ) {
      if ((uVar1 & 1) != 0) {
        dVar2 = dVar2 * x;
      }
      if (uVar1 < 2) break;
      uVar1 = uVar1 >> 1;
      x = x * x;
    }
    if (y < 0) {
      dVar2 = 1.0 / dVar2;
    }
    return dVar2;
  }
  dVar2 = pow(x,(double)y);
  return dVar2;
}

Assistant:

double JavascriptNumber::DirectPowDoubleInt(double x, int32 y)
    {
        // For exponent in [-8, 8], aggregate the product according to binary representation
        // of exponent. This acceleration may lead to significant deviation for larger exponent
        if (y >= -8 && y <= 8)
        {
            uint32 uexp = static_cast<uint32>(y >= 0 ? y : -y);
            for (double result = 1.0; ; x *= x)
            {
                if ((uexp & 1) != 0)
                {
                    result *= x;
                }
                if ((uexp >>= 1) == 0)
                {
                    return (y < 0 ? (1.0 / result) : result);
                }
            }
        }

        // always call pow(double, double) in C runtime which has a bug to process pow(double, int).
        return ::pow(x, static_cast<double>(y));
    }